

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::RunCheckForUnusedVariables(cmake *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  ostringstream msg;
  string local_1e8;
  cmListFileBacktrace local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Manually-specified variables were not used by the project:",0x3a)
  ;
  p_Var2 = (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    bVar3 = false;
    do {
      if ((char)p_Var2[2]._M_color == _S_red) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
        bVar3 = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
    if (bVar3) {
      std::__cxx11::stringbuf::str();
      cmListFileBacktrace::cmListFileBacktrace(&local_1c8);
      cmMessenger::IssueMessage(this->Messenger,WARNING,&local_1e8,&local_1c8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmake::RunCheckForUnusedVariables()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  bool haveUnused = false;
  std::ostringstream msg;
  msg << "Manually-specified variables were not used by the project:";
  for (std::map<std::string, bool>::const_iterator it =
         this->UsedCliVariables.begin();
       it != this->UsedCliVariables.end(); ++it) {
    if (!it->second) {
      haveUnused = true;
      msg << "\n  " << it->first;
    }
  }
  if (haveUnused) {
    this->IssueMessage(cmake::WARNING, msg.str());
  }
#endif
}